

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t do_helper_clc(CPUS390XState_conflict *env,uint32_t l,uint64_t s1,uint64_t s2,uintptr_t ra)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint8_t y;
  uint uStack_34;
  uint8_t x;
  uint32_t cc;
  uint32_t i;
  uintptr_t ra_local;
  uint64_t s2_local;
  uint64_t s1_local;
  uint32_t l_local;
  CPUS390XState_conflict *env_local;
  
  uStack_34 = 0;
  while( true ) {
    if (l < uStack_34) {
      return 0;
    }
    uVar1 = cpu_ldub_data_ra_s390x(env,s1 + uStack_34,ra);
    uVar2 = cpu_ldub_data_ra_s390x(env,s2 + uStack_34,ra);
    if ((uVar1 & 0xff) < (uVar2 & 0xff)) break;
    if ((uVar2 & 0xff) < (uVar1 & 0xff)) {
      return 2;
    }
    uStack_34 = uStack_34 + 1;
  }
  return 1;
}

Assistant:

static uint32_t do_helper_clc(CPUS390XState *env, uint32_t l, uint64_t s1,
                              uint64_t s2, uintptr_t ra)
{
    uint32_t i;
    uint32_t cc = 0;

    HELPER_LOG("%s l %d s1 %" PRIx64 " s2 %" PRIx64 "\n",
               __func__, l, s1, s2);

    for (i = 0; i <= l; i++) {
        uint8_t x = cpu_ldub_data_ra(env, s1 + i, ra);
        uint8_t y = cpu_ldub_data_ra(env, s2 + i, ra);
        HELPER_LOG("%02x (%c)/%02x (%c) ", x, x, y, y);
        if (x < y) {
            cc = 1;
            break;
        } else if (x > y) {
            cc = 2;
            break;
        }
    }

    HELPER_LOG("\n");
    return cc;
}